

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O0

void Gia_ManDualXorN(Gia_Man_t *p,int *pLits,int n,int *LitZ)

{
  int iVar1;
  int local_2c;
  int i;
  int *LitZ_local;
  int n_local;
  int *pLits_local;
  Gia_Man_t *p_local;
  
  *LitZ = 0;
  LitZ[1] = 0;
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    iVar1 = Gia_ManHashXor(p,*LitZ,pLits[local_2c << 1]);
    *LitZ = iVar1;
    iVar1 = Gia_ManHashOr(p,LitZ[1],pLits[local_2c * 2 + 1]);
    LitZ[1] = iVar1;
  }
  return;
}

Assistant:

void Gia_ManDualXorN( Gia_Man_t * p, int * pLits, int n, int LitZ[2] )
{
    int i;
    LitZ[0] = 0;
    LitZ[1] = 0;
    for ( i = 0; i < n; i++ )
    {
        LitZ[0] = Gia_ManHashXor( p, LitZ[0], pLits[2*i] );
        LitZ[1] = Gia_ManHashOr ( p, LitZ[1], pLits[2*i+1] );
    }
}